

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicBasicTestInstance *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  SharedPtrStateBase *pSVar3;
  VkImage VVar4;
  VkImageView VVar5;
  VkRenderPass obj;
  VkFramebuffer obj_00;
  VkSubpassDescription subpass;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar6;
  long lVar7;
  ImageCreateInfo *pIVar8;
  undefined8 *puVar9;
  byte bVar10;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  VkStructureType VVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  VkImageCreateFlags VVar23;
  VkImageType VVar24;
  VkFormat VVar25;
  deUint32 dVar26;
  deUint32 dVar27;
  undefined4 uVar28;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  VkAllocationCallbacks *pVStack_260;
  Move<vk::Handle<(vk::HandleType)23>_> local_258;
  ImageViewCreateInfo depthViewInfo;
  ImageCreateInfo depthImageCreateInfo;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  ImageViewCreateInfo attachmentViewInfo;
  ImageCreateInfo colorImageCreateInfo;
  
  bVar10 = 0;
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)
  ;
  _extent.depth = 1;
  _extent.width = 0x40;
  _extent.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&colorImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar6 = Context::getDefaultAllocator
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthImageCreateInfo,vk,device,&colorImageCreateInfo.super_VkImageCreateInfo,
             pAVar6,(MemoryRequirement)0x0);
  pSVar3 = (this->m_colorAttachmentImage).m_state;
  if (pSVar3 != (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar3->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_colorAttachmentImage).m_ptr = (Image *)0x0;
        (*((this->m_colorAttachmentImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar3 = (this->m_colorAttachmentImage).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorAttachmentImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorAttachmentImage).m_ptr =
         (Image *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_colorAttachmentImage).m_state =
         (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) =
           *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar2 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
      (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8))();
      }
      depthImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
    }
  }
  VVar4.m_internal =
       (((this->m_colorAttachmentImage).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  VVar25 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&depthImageCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar4,VK_IMAGE_VIEW_TYPE_2D,VVar25,
             (VkComponentMapping *)&depthImageCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo,vk,device,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  VVar5.m_internal =
       (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar5);
  }
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
               &depthViewInfo.super_VkImageViewCreateInfo.pNext,
               (VkImageView)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
  }
  uVar15 = 0;
  uVar16 = 0;
  uVar13 = 1;
  uVar14 = 0;
  uVar11 = 1;
  uVar12 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x40;
  _extent_00.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthImageCreateInfo,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent_00,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar6 = Context::getDefaultAllocator
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthViewInfo,vk,device,&depthImageCreateInfo.super_VkImageCreateInfo,pAVar6,
             (MemoryRequirement)0x0);
  pSVar3 = (this->m_depthImage).m_state;
  if (pSVar3 != (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar3->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_depthImage).m_ptr = (Image *)0x0;
        (*((this->m_depthImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_depthImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar3 = (this->m_depthImage).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_depthImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_depthImage).m_ptr = (Image *)depthViewInfo.super_VkImageViewCreateInfo._0_8_;
    (this->m_depthImage).m_state =
         (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) =
           *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_depthImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar2 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
      (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
        (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 8))();
      }
      depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
    }
  }
  VVar4.m_internal =
       (((this->m_depthImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data
       .object.m_internal;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_258,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&depthViewInfo,VVar4,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             (VkComponentMapping *)&local_258,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&attachments,vk,device,
             &depthViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator = pVStack_260;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar5.m_internal =
       (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               VVar5);
  }
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  if (attachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
               &attachments.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkImageView)
               attachments.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (depthImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depthImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (colorImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)&colorImageCreateInfo,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  attachment.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment);
  uVar28 = 0;
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  VVar23 = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  VVar24 = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  VVar25 = depthImageCreateInfo.super_VkImageCreateInfo.format;
  dVar26 = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  VVar19 = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  uVar20 = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  uVar21 = SUB84(depthImageCreateInfo.super_VkImageCreateInfo.pNext,0);
  uVar22 = (undefined4)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  uVar17 = 0x6ccc76;
  uVar18 = 0;
  attachment_00.samples = uVar21;
  attachment_00.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment_00.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment_00.loadOp = uVar22;
  attachment_00.storeOp = VVar23;
  attachment_00.stencilLoadOp = VVar24;
  attachment_00.stencilStoreOp = VVar25;
  attachment_00.initialLayout = dVar26;
  attachment_00.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  dVar27 = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment_00);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  depthAttachmentReference.attachment = 1;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       (void *)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext & 0xffffffff00000000);
  depthImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  depthImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_R4G4_UNORM_PACK8;
  depthImageCreateInfo.super_VkImageCreateInfo.extent._4_8_ = &colorAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.mipLevels = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.arrayLayers = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._48_8_ = &depthAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.usage = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.queueFamilyIndexCount = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._68_4_ = 0;
  pIVar8 = &depthImageCreateInfo;
  puVar9 = (undefined8 *)&stack0xfffffffffffffd38;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *(undefined8 *)&pIVar8->super_VkImageCreateInfo;
    pIVar8 = (ImageCreateInfo *)((long)pIVar8 + (ulong)bVar10 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar12;
  subpass.flags = uVar11;
  subpass.inputAttachmentCount = uVar13;
  subpass._12_4_ = uVar14;
  subpass.pInputAttachments._0_4_ = uVar15;
  subpass.pInputAttachments._4_4_ = uVar16;
  subpass.colorAttachmentCount = uVar17;
  subpass._28_4_ = uVar18;
  subpass.pColorAttachments._0_4_ = VVar19;
  subpass.pColorAttachments._4_4_ = uVar20;
  subpass.pResolveAttachments._0_4_ = uVar21;
  subpass.pResolveAttachments._4_4_ = uVar22;
  subpass.pDepthStencilAttachment._0_4_ = VVar23;
  subpass.pDepthStencilAttachment._4_4_ = VVar24;
  subpass.preserveAttachmentCount = VVar25;
  subpass._60_4_ = dVar26;
  subpass.pPreserveAttachments._0_4_ = dVar27;
  subpass.pPreserveAttachments._4_4_ = uVar28;
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)&colorImageCreateInfo,subpass);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&depthViewInfo,vk,device,
             (VkRenderPassCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  attachmentViewInfo.super_VkImageViewCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.image =
       depthViewInfo.super_VkImageViewCreateInfo.image;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  obj.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
               &depthViewInfo.super_VkImageViewCreateInfo.pNext,
               (VkRenderPass)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
  }
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)&attachmentViewInfo,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,&attachments,0x40,0x40,1);
  ::vk::createFramebuffer
            (&local_258,vk,device,(VkFramebufferCreateInfo *)&attachmentViewInfo,
             (VkAllocationCallbacks *)0x0);
  depthViewInfo.super_VkImageViewCreateInfo._16_8_ =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal =
       (deUint64)local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
  ;
  depthViewInfo.super_VkImageViewCreateInfo._0_8_ =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  depthViewInfo.super_VkImageViewCreateInfo.pNext =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_00);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
  if (local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (attachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)&colorImageCreateInfo);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[5])
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicBasicTestInstance::iterate (void)
{
	checkExtensions();
	creatColorAttachmentAndRenderPass();
	createPipeline();
	return executeTest();
}